

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getLockingMode(char *z)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  byte bVar4;
  byte *pbVar5;
  byte bVar6;
  
  if (z != (char *)0x0) {
    bVar4 = *z;
    pcVar3 = "normal";
    uVar2 = 0;
    if (bVar4 != 0) {
      pbVar5 = (byte *)(z + 1);
      pcVar1 = "exclusive";
      bVar6 = bVar4;
      do {
        uVar2 = (ulong)bVar6;
        if (""[bVar6] != ""[(byte)*pcVar1]) break;
        pcVar1 = (char *)((byte *)pcVar1 + 1);
        bVar6 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        uVar2 = 0;
      } while (bVar6 != 0);
      if (""[uVar2] == ""[(byte)*pcVar1]) {
        return 1;
      }
      if (bVar4 == 0) {
        uVar2 = 0;
      }
      else {
        pbVar5 = (byte *)(z + 1);
        pcVar3 = "normal";
        do {
          uVar2 = (ulong)bVar4;
          if (""[bVar4] != ""[(byte)*pcVar3]) break;
          pcVar3 = (char *)((byte *)pcVar3 + 1);
          bVar4 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          uVar2 = 0;
        } while (bVar4 != 0);
      }
    }
    if (""[uVar2] == ""[(byte)*pcVar3]) {
      return 0;
    }
  }
  return -1;
}

Assistant:

static int getLockingMode(const char *z){
  if( z ){
    if( 0==sqlite3StrICmp(z, "exclusive") ) return PAGER_LOCKINGMODE_EXCLUSIVE;
    if( 0==sqlite3StrICmp(z, "normal") ) return PAGER_LOCKINGMODE_NORMAL;
  }
  return PAGER_LOCKINGMODE_QUERY;
}